

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void __thiscall QSslSocket::startClientEncryption(QSslSocket *this)

{
  QSslSocketPrivate *this_00;
  TlsCryptograph *pTVar1;
  bool bVar2;
  SocketState SVar3;
  QLoggingCategory *pQVar4;
  long in_FS_OFFSET;
  char16_t local_3c [2];
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (this_00->mode == UnencryptedMode) {
    SVar3 = QAbstractSocket::state((QAbstractSocket *)this);
    if (SVar3 == ConnectedState) {
      bVar2 = QSslSocketPrivate::supportsSsl();
      if (bVar2) {
        bVar2 = QSslSocketPrivate::verifyProtocolSupported
                          (this_00,"QSslSocket::startClientEncryption:");
        if (bVar2) {
          this_00->mode = SslClientMode;
          local_38.d.ptr = local_3c;
          local_3c[0] = L'\x01';
          local_3c[1] = L'\0';
          local_38.d.d = (Data *)0x0;
          QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)&local_38);
          pTVar1 = (this_00->backend)._M_t.
                   super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                   .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
          if (pTVar1 != (TlsCryptograph *)0x0) {
            (**(code **)(*(long *)pTVar1 + 0x80))();
          }
        }
      }
      else {
        pQVar4 = QtPrivateLogging::lcSsl();
        if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          startClientEncryption((QSslSocket *)pQVar4);
        }
        QMetaObject::tr((char *)&local_38,(char *)&staticMetaObject,0x27f41b);
        QAbstractSocketPrivate::setErrorAndEmit
                  ((QAbstractSocketPrivate *)this_00,SslInternalError,&local_38);
        if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    else {
      pQVar4 = QtPrivateLogging::lcSsl();
      if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        startClientEncryption((QSslSocket *)pQVar4);
      }
    }
  }
  else {
    pQVar4 = QtPrivateLogging::lcSsl();
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      startClientEncryption((QSslSocket *)pQVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::startClientEncryption()
{
    Q_D(QSslSocket);
    if (d->mode != UnencryptedMode) {
        qCWarning(lcSsl,
                  "QSslSocket::startClientEncryption: cannot start handshake on non-plain connection");
        return;
    }
    if (state() != ConnectedState) {
        qCWarning(lcSsl,
                  "QSslSocket::startClientEncryption: cannot start handshake when not connected");
        return;
    }

    if (!supportsSsl()) {
        qCWarning(lcSsl, "QSslSocket::startClientEncryption: TLS initialization failed");
        d->setErrorAndEmit(QAbstractSocket::SslInternalError, tr("TLS initialization failed"));
        return;
    }

    if (!d->verifyProtocolSupported("QSslSocket::startClientEncryption:"))
        return;

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::startClientEncryption()";
#endif
    d->mode = SslClientMode;
    emit modeChanged(d->mode);
    d->startClientEncryption();
}